

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

bool __thiscall
Lib::
FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_Kernel::LookaheadLiteralSelector::GenIteratorIterator::TermUnificationRetriever,_Lib::VirtualIterator<std::tuple<>_>_>_>
::hasNext(FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_Kernel::LookaheadLiteralSelector::GenIteratorIterator::TermUnificationRetriever,_Lib::VirtualIterator<std::tuple<>_>_>_>
          *this)

{
  SubscriptionData *pSVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_Kernel::LookaheadLiteralSelector::GenIteratorIterator::TermUnificationRetriever,_Lib::VirtualIterator<std::tuple<>_>_>
  local_58;
  OptionBase<Lib::VirtualIterator<std::tuple<>_>_> local_48;
  
  while( true ) {
    bVar2 = (this->_current).super_OptionBase<Lib::VirtualIterator<std::tuple<>_>_>._isSome;
    if (bVar2 != true) {
      return bVar2;
    }
    cVar3 = (**(code **)(*(long *)(this->_current).
                                  super_OptionBase<Lib::VirtualIterator<std::tuple<>_>_>._elem._elem
                        + 0x10))();
    if (cVar3 != '\0') break;
    iVar4 = (*((this->_master)._inner._core)->_vptr_IteratorCore[2])();
    if ((char)iVar4 == '\0') {
      local_48._isSome = false;
      local_48._1_7_ = 0;
      local_48._elem._elem = (Value)0x0;
    }
    else {
      MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_Kernel::LookaheadLiteralSelector::GenIteratorIterator::TermUnificationRetriever,_Lib::VirtualIterator<std::tuple<>_>_>
      ::next(&local_58);
      local_58._inner._core = (IteratorCore<Kernel::Term_*> *)local_58._func._index;
      if (local_58._func._index != (TermIndex *)0x0) {
        pSVar1 = &((local_58._func._index)->super_Index)._addedSD;
        *(int *)&pSVar1->_obj = *(int *)&pSVar1->_obj + 1;
      }
      OptionBase<Lib::VirtualIterator<std::tuple<>_>_>::OptionBase
                (&local_48,(VirtualIterator<std::tuple<>_> *)&local_58._inner);
    }
    OptionBase<Lib::VirtualIterator<std::tuple<>_>_>::operator=
              (&(this->_current).super_OptionBase<Lib::VirtualIterator<std::tuple<>_>_>,&local_48);
    OptionBase<Lib::VirtualIterator<std::tuple<>_>_>::~OptionBase(&local_48);
    if ((char)iVar4 != '\0') {
      VirtualIterator<std::tuple<>_>::~VirtualIterator
                ((VirtualIterator<std::tuple<>_> *)&local_58._inner);
      VirtualIterator<std::tuple<>_>::~VirtualIterator((VirtualIterator<std::tuple<>_> *)&local_58);
    }
  }
  return true;
}

Assistant:

bool hasNext()
  {
    while (_current.isSome()) {
      if (_current->hasNext()) {
        return true;
      } else {
        _current = _master.hasNext() 
          ? Option<Inner>(move_if_value<Inner>(_master.next())) 
          : Option<Inner>();
      }
    }
    return false;
  }